

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O2

void duckdb_je_hpdata_unreserve(hpdata_t *hpdata,void *addr,size_t sz)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  fb_group_t *max_bit;
  size_t min_bit;
  ulong uVar5;
  ulong uVar6;
  ulong nbits;
  
  uVar6 = (long)addr - (long)hpdata->h_address;
  nbits = uVar6 >> 0xc;
  uVar5 = sz >> 0xc;
  uVar4 = (uint)nbits & 0x3f;
  uVar2 = 0x40 - (ulong)uVar4;
  if (uVar4 + uVar5 < 0x41) {
    uVar2 = uVar5;
  }
  uVar1 = hpdata->h_longest_free_range;
  uVar6 = uVar6 >> 0x12;
  max_bit = hpdata->active_pages + uVar6 + 1;
  hpdata->active_pages[uVar6] =
       hpdata->active_pages[uVar6] &
       ~((0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU)) << (sbyte)uVar4);
  for (uVar2 = uVar5 - uVar2; 0x40 < uVar2; uVar2 = uVar2 - 0x40) {
    *max_bit = 0;
    max_bit = max_bit + 1;
  }
  if (uVar2 != 0) {
    *max_bit = *max_bit & ~(0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU));
  }
  uVar2 = fb_fls(hpdata->active_pages,nbits,(size_t)max_bit);
  sVar3 = fb_ffs(hpdata->active_pages,(uVar5 + nbits) - 1,min_bit);
  if (uVar1 < sVar3 + ~uVar2) {
    hpdata->h_longest_free_range = sVar3 + ~uVar2;
  }
  hpdata->h_nactive = hpdata->h_nactive - uVar5;
  return;
}

Assistant:

void
hpdata_unreserve(hpdata_t *hpdata, void *addr, size_t sz) {
	hpdata_assert_consistent(hpdata);
	/* See the comment in reserve. */
	assert(!hpdata->h_in_psset || hpdata->h_updating);
	assert(((uintptr_t)addr & PAGE_MASK) == 0);
	assert((sz & PAGE_MASK) == 0);
	size_t begin = ((uintptr_t)addr - (uintptr_t)hpdata_addr_get(hpdata))
	    >> LG_PAGE;
	assert(begin < HUGEPAGE_PAGES);
	size_t npages = sz >> LG_PAGE;
	size_t old_longest_range = hpdata_longest_free_range_get(hpdata);

	fb_unset_range(hpdata->active_pages, HUGEPAGE_PAGES, begin, npages);
	/* We might have just created a new, larger range. */
	size_t new_begin = (fb_fls(hpdata->active_pages, HUGEPAGE_PAGES,
	    begin) + 1);
	size_t new_end = fb_ffs(hpdata->active_pages, HUGEPAGE_PAGES,
	    begin + npages - 1);
	size_t new_range_len = new_end - new_begin;

	if (new_range_len > old_longest_range) {
		hpdata_longest_free_range_set(hpdata, new_range_len);
	}

	hpdata->h_nactive -= npages;

	hpdata_assert_consistent(hpdata);
}